

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  pointer pbVar2;
  pointer paVar3;
  pointer paVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  long lVar7;
  stringstream stream;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  lVar7 = (long)this->mNumArgs;
  if (-1 < lVar7) {
    bVar1 = this->field_0xbc;
    if ((bVar1 & 1) == 0) {
      if (((long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4 != lVar7) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(this->mUsedName)._M_dataplus._M_p,
                            (this->mUsedName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": expected ",0xb);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," argument(s). ",0xe);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," provided.",10);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_1c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((bVar1 & 4) == 0) {
      if (((bVar1 & 2) != 0) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        pbVar2 = (this->mNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": required.",0xb);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_1c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      paVar3 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar4 = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)paVar3 - (long)paVar4 >> 4 != lVar7) &&
         ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(this->mUsedName)._M_dataplus._M_p,
                            (this->mUsedName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": expected ",0xb);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," argument(s). ",0xe);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," provided.",10);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_1c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (paVar3 == paVar4 && (~bVar1 & 6) == 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,(this->mUsedName)._M_dataplus._M_p,
                            (this->mUsedName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": no value provided.",0x14);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_1c8);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

auto maybe_nargs() const -> std::optional<size_t> {
    if (mNumArgs < 0)
      return std::nullopt;
    else
      return static_cast<size_t>(mNumArgs);
  }